

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O2

float deqp::gls::destructiveMedian<float>(vector<float,_std::allocator<float>_> *data)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  pointer pfVar1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Var2;
  ulong uVar3;
  float fVar4;
  
  __first._M_current =
       (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar3 = (long)__last._M_current - (long)__first._M_current >> 1 & 0xfffffffffffffffc;
  _Var2._M_current = __first._M_current + uVar3;
  std::nth_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            (__first,_Var2,__last);
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  fVar4 = *(__first._M_current + uVar3);
  if ((*(int *)&(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (int)pfVar1 & 4U) == 0) {
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pfVar1,_Var2._M_current);
    fVar4 = (fVar4 + *_Var2._M_current) * 0.5;
  }
  return fVar4;
}

Assistant:

float destructiveMedian (vector<T>& data)
{
	const typename vector<T>::iterator mid = data.begin()+data.size()/2;

	std::nth_element(data.begin(), mid, data.end());

	if (data.size()%2 == 0) // Even number of elements, need average of two centermost elements
		return (*mid + *std::max_element(data.begin(), mid))*0.5f; // Data is partially sorted around mid, mid is half an item after center
	else
		return *mid;
}